

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaDec.c
# Opt level: O0

SRes LzmaDecode(Byte *dest,SizeT *destLen,Byte *src,SizeT *srcLen,Byte *propData,uint propSize,
               ELzmaFinishMode finishMode,ELzmaStatus *status,ISzAllocPtr alloc)

{
  Byte *dicLimit;
  ulong uVar1;
  int _result_;
  SizeT inSize;
  SizeT outSize;
  undefined1 local_c0 [4];
  SRes res;
  CLzmaDec p;
  uint propSize_local;
  Byte *propData_local;
  SizeT *srcLen_local;
  Byte *src_local;
  SizeT *destLen_local;
  Byte *dest_local;
  
  dicLimit = (Byte *)*destLen;
  uVar1 = *srcLen;
  *srcLen = 0;
  *destLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  if (uVar1 < 5) {
    dest_local._4_4_ = 6;
  }
  else {
    p.probs_1664 = (CLzmaProb *)0x0;
    p.prop.lc = '\0';
    p.prop.lp = '\0';
    p.prop.pb = '\0';
    p.prop._pad_ = '\0';
    p.prop.dicSize = 0;
    p._124_4_ = propSize;
    dest_local._4_4_ = LzmaDec_AllocateProbs((CLzmaDec *)local_c0,propData,propSize,alloc);
    if (dest_local._4_4_ == 0) {
      p.probs_1664 = (CLzmaProb *)dest;
      p.dic = dicLimit;
      LzmaDec_Init((CLzmaDec *)local_c0);
      *srcLen = uVar1;
      outSize._4_4_ =
           LzmaDec_DecodeToDic((CLzmaDec *)local_c0,(SizeT)dicLimit,src,srcLen,finishMode,status);
      *destLen = p.dicBufSize;
      if ((outSize._4_4_ == 0) && (*status == LZMA_STATUS_NEEDS_MORE_INPUT)) {
        outSize._4_4_ = 6;
      }
      LzmaDec_FreeProbs((CLzmaDec *)local_c0,alloc);
      dest_local._4_4_ = outSize._4_4_;
    }
  }
  return dest_local._4_4_;
}

Assistant:

SRes LzmaDecode(Byte *dest, SizeT *destLen, const Byte *src, SizeT *srcLen,
    const Byte *propData, unsigned propSize, ELzmaFinishMode finishMode,
    ELzmaStatus *status, ISzAllocPtr alloc)
{
  CLzmaDec p;
  SRes res;
  SizeT outSize = *destLen, inSize = *srcLen;
  *destLen = *srcLen = 0;
  *status = LZMA_STATUS_NOT_SPECIFIED;
  if (inSize < RC_INIT_SIZE)
    return SZ_ERROR_INPUT_EOF;
  LzmaDec_CONSTRUCT(&p)
  RINOK(LzmaDec_AllocateProbs(&p, propData, propSize, alloc))
  p.dic = dest;
  p.dicBufSize = outSize;
  LzmaDec_Init(&p);
  *srcLen = inSize;
  res = LzmaDec_DecodeToDic(&p, outSize, src, srcLen, finishMode, status);
  *destLen = p.dicPos;
  if (res == SZ_OK && *status == LZMA_STATUS_NEEDS_MORE_INPUT)
    res = SZ_ERROR_INPUT_EOF;
  LzmaDec_FreeProbs(&p, alloc);
  return res;
}